

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEngine.c
# Opt level: O2

JsEngine * JsCreateEngine(void)

{
  JsVm *pJVar1;
  JsEngine *e;
  JsList pvVar2;
  JsLock pvVar3;
  
  pJVar1 = JsGetVm();
  e = (JsEngine *)JsMalloc(0x30);
  e->vm = pJVar1;
  JsEngine2Vm(e);
  e->state = JS_ENGINE_KERNEL;
  e->exec = (JsContext *)0x0;
  pvVar2 = JsCreateList();
  e->waits = pvVar2;
  pvVar2 = JsCreateList();
  e->pools = pvVar2;
  pvVar3 = JsCreateLock();
  e->lock = pvVar3;
  return e;
}

Assistant:

struct JsEngine* JsCreateEngine(){
	struct JsVm* vm = JsGetVm();
	struct JsEngine* e = (struct JsEngine*)JsMalloc(sizeof(struct JsEngine));
	e->vm = vm;
	JsEngine2Vm(e);
	
	e->state = JS_ENGINE_KERNEL;
	
	e->exec = NULL;
	e->waits = JsCreateList();
	e->pools = JsCreateList();
	
	e->lock = JsCreateLock();
	return e;
}